

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

void peparse::deleteBuffer(bounded_buffer *b)

{
  undefined8 *in_RDI;
  
  if (in_RDI != (undefined8 *)0x0) {
    if ((*(byte *)((long)in_RDI + 0xc) & 1) == 0) {
      munmap((void *)*in_RDI,(ulong)*(uint *)(in_RDI + 1));
      close(*(int *)in_RDI[2]);
    }
    if ((void *)in_RDI[2] != (void *)0x0) {
      operator_delete((void *)in_RDI[2],4);
    }
    if (in_RDI != (undefined8 *)0x0) {
      operator_delete(in_RDI,0x18);
    }
  }
  return;
}

Assistant:

void deleteBuffer(bounded_buffer *b) {
  if (b == nullptr) {
    return;
  }

  if (!b->copy) {
#ifdef _WIN32
    UnmapViewOfFile(b->buf);
    CloseHandle(b->detail->sec);
    CloseHandle(b->detail->file);
#else
    munmap(b->buf, b->bufLen);
    close(b->detail->fd);
#endif
  }

  delete b->detail;
  delete b;
}